

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int analyze_miniscript_value
              (char *message,char **key_name_array,char **key_value_array,size_t array_len,
              uint32_t *network,uint32_t flags,miniscript_node_t *node,
              miniscript_node_t *parent_node)

{
  int iVar1;
  char *pcVar2;
  longlong lVar3;
  address_script_t *local_78;
  address_script_t *addr_item;
  size_t addr_tbl_max;
  char *err_ptr;
  char *buf;
  size_t buf_len;
  size_t str_len;
  size_t index;
  int ret;
  uint32_t flags_local;
  uint32_t *network_local;
  size_t array_len_local;
  char **key_value_array_local;
  char **key_name_array_local;
  char *message_local;
  
  err_ptr = (char *)0x0;
  addr_tbl_max = 0;
  local_78 = (address_script_t *)0x0;
  if ((node == (miniscript_node_t *)0x0) ||
     ((((parent_node != (miniscript_node_t *)0x0 && (parent_node->info == (miniscript_item_t *)0x0))
       || (message == (char *)0x0)) || (*message == '\0')))) {
    message_local._4_4_ = -2;
  }
  else {
    if (network != (uint32_t *)0x0) {
      for (str_len = 0; str_len < 5; str_len = str_len + 1) {
        if (*network == (uint)g_network_address_table[str_len].network) {
          local_78 = g_network_address_table + str_len;
          break;
        }
      }
      if (local_78 == (address_script_t *)0x0) {
        return -2;
      }
    }
    index._4_4_ = flags;
    _ret = network;
    network_local = (uint32_t *)array_len;
    array_len_local = (size_t)key_value_array;
    key_value_array_local = key_name_array;
    key_name_array_local = (char **)message;
    buf_len = strlen(message);
    if ((parent_node == (miniscript_node_t *)0x0) || (parent_node->info->kind != 0x40002)) {
      if (network_local != (uint32_t *)0x0) {
        for (str_len = 0; str_len < network_local; str_len = str_len + 1) {
          iVar1 = strncmp((char *)key_name_array_local,key_value_array_local[str_len],buf_len + 1);
          if (iVar1 == 0) {
            pcVar2 = wally_strdup(*(char **)(array_len_local + str_len * 8));
            node->data = pcVar2;
            if (node->data == (char *)0x0) {
              return -3;
            }
            buf_len = strlen(node->data);
            node->data_size = (uint32_t)buf_len;
            break;
          }
        }
      }
      if (node->data == (char *)0x0) {
        pcVar2 = wally_strdup((char *)key_name_array_local);
        node->data = pcVar2;
        node->data_size = (uint32_t)buf_len;
      }
      if ((parent_node == (miniscript_node_t *)0x0) ||
         (((parent_node->info->kind != 0x50002 && (parent_node->info->kind != 0x30001)) &&
          ((parent_node->info->kind != 0x40001 &&
           ((parent_node->info->kind != 0x50001 && (parent_node->info->kind != 0x60001)))))))) {
        lVar3 = strtoll(node->data,(char **)&addr_tbl_max,10);
        node->number = lVar3;
        if ((addr_tbl_max == 0) || (*(char *)addr_tbl_max == '\0')) {
          node->kind = 8;
          node->type_properties = 0x31101;
          if (node->number == 0) {
            node->type_properties = node->type_properties | 0xa800;
          }
          else {
            node->type_properties = node->type_properties | 0x4000;
          }
          message_local._4_4_ = 0;
        }
        else {
          message_local._4_4_ = analyze_miniscript_key(local_78,index._4_4_,node,parent_node);
        }
      }
      else {
        err_ptr = wally_strdup(node->data);
        if ((uchar *)err_ptr == (uchar *)0x0) {
          message_local._4_4_ = -3;
        }
        else {
          index._0_4_ = wally_hex_to_bytes(node->data,(uchar *)err_ptr,buf_len,(size_t *)&buf);
          if ((int)index == 0) {
            node->kind = 4;
          }
          wally_free_string(err_ptr);
          message_local._4_4_ = (int)index;
        }
      }
    }
    else {
      message_local._4_4_ =
           analyze_miniscript_addr
                     ((char *)key_name_array_local,node,parent_node,local_78,(uchar *)0x0,0,
                      (size_t *)0x0);
    }
  }
  return message_local._4_4_;
}

Assistant:

static int analyze_miniscript_value(
    const char *message,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t *network,
    uint32_t flags,
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent_node)
{
    int ret;
    size_t index;
    size_t str_len;
    size_t buf_len;
    char *buf = NULL;
    char *err_ptr = NULL;
    size_t addr_tbl_max = sizeof(g_network_address_table) / sizeof(struct address_script_t);
    const struct address_script_t *addr_item = NULL;

    if (!node || (parent_node && !parent_node->info) || !message || !message[0])
        return WALLY_EINVAL;

    if (network) {
        for (index = 0; index < addr_tbl_max; ++index) {
            if (*network == g_network_address_table[index].network) {
                addr_item = &g_network_address_table[index];
                break;
            }
        }
        if (addr_item == NULL)
            return WALLY_EINVAL;
    }

    str_len = strlen(message);

    if (parent_node && (parent_node->info->kind == DESCRIPTOR_KIND_DESCRIPTOR_ADDR))
        return analyze_miniscript_addr(message, node, parent_node, addr_item, NULL, 0, NULL);

    /* check key_name_array */
    if (array_len) {
        for (index = 0; index < array_len; ++index) {
            if (strncmp(message, key_name_array[index], str_len + 1) == 0) {
                node->data = wally_strdup(key_value_array[index]);
                if (!node->data)
                    return WALLY_ENOMEM;

                str_len = strlen(node->data);
                node->data_size = (uint32_t)str_len;
                break;
            }
        }
    }

    if (!node->data) {
        node->data = wally_strdup(message);
        node->data_size = (uint32_t)str_len;
    }

    if (parent_node &&
        ((parent_node->info->kind == DESCRIPTOR_KIND_DESCRIPTOR_RAW) ||
         (parent_node->info->kind == DESCRIPTOR_KIND_MINISCRIPT_SHA256) ||
         (parent_node->info->kind == DESCRIPTOR_KIND_MINISCRIPT_HASH256) ||
         (parent_node->info->kind == DESCRIPTOR_KIND_MINISCRIPT_RIPEMD160) ||
         (parent_node->info->kind == DESCRIPTOR_KIND_MINISCRIPT_HASH160))) {
        buf = wally_strdup(node->data);
        if (!buf)
            return WALLY_ENOMEM;

        ret = wally_hex_to_bytes(node->data, (unsigned char *)buf, str_len, &buf_len);
        if (ret == WALLY_OK) {
            node->kind = DESCRIPTOR_KIND_RAW;
        }
        wally_free_string(buf);
        return ret;
    }

    node->number = strtoll(node->data, &err_ptr, 10);
    if ((err_ptr == NULL) || (*err_ptr == '\0')) {
        node->kind = DESCRIPTOR_KIND_NUMBER;
        node->type_properties = MINISCRIPT_TYPE_B | MINISCRIPT_PROPERTY_Z |
                                MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_M |
                                MINISCRIPT_PROPERTY_X;
        if (node->number == 0) {
            node->type_properties |= MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_E |
                                     MINISCRIPT_PROPERTY_S;
        } else {
            node->type_properties |= MINISCRIPT_PROPERTY_F;
        }
        return WALLY_OK;
    }

    return analyze_miniscript_key(addr_item, flags, node, parent_node);
}